

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

bilingual_str * common::AmountHighWarn(string *optname)

{
  long lVar1;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_ffffffffffffff68;
  ConstevalStringLiteral in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  bilingual_str *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::_(in_stack_ffffffffffffffb8);
  tinyformat::format<std::__cxx11::string>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  bilingual_str::~bilingual_str(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str AmountHighWarn(const std::string& optname)
{
    return strprintf(_("%s is set very high!"), optname);
}